

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

spv_result_t spvtools::val::PerformCfgChecks(ValidationState_t *_)

{
  undefined8 this;
  bool bVar1;
  uint32_t uVar2;
  spv_result_t sVar3;
  int iVar4;
  vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_> *this_00;
  size_t sVar5;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_01;
  reference pvVar6;
  Instruction *pIVar7;
  DiagnosticStream *pDVar8;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar9;
  BasicBlock *pBVar10;
  BasicBlock *pBVar11;
  spv_const_validator_options psVar12;
  reference ppBVar13;
  reference ppVar14;
  bool local_ac1;
  spv_result_t error_1;
  spv_result_t error;
  anon_class_8_1_3fad72bc local_a70;
  function<void_(const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*)> local_a68;
  function<void_(const_spvtools::val::BasicBlock_*)> local_a48;
  function<void_(const_spvtools::val::BasicBlock_*)> local_a28;
  GetBlocksFunction local_a08;
  BasicBlock *local_9e8;
  pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*> edge_2;
  iterator __end5_1;
  iterator __begin5_1;
  vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
  *__range5_1;
  undefined1 local_9a0 [8];
  vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
  postdom_edges;
  anon_class_8_1_5ae888f1 local_968;
  function<void_(const_spvtools::val::BasicBlock_*)> local_960;
  function<void_(const_spvtools::val::BasicBlock_*)> local_940;
  GetBlocksFunction local_920;
  BasicBlock *local_900;
  pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*> edge_1;
  iterator __end5;
  iterator __begin5;
  vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
  *__range5;
  undefined1 local_8b8 [8];
  vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
  edges_1;
  anon_class_8_1_8ddbd94e local_880;
  function<void_(const_spvtools::val::BasicBlock_*)> local_878;
  function<void_(const_spvtools::val::BasicBlock_*)> local_858;
  GetBlocksFunction local_838;
  undefined1 local_818 [8];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  back_edges;
  vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  postdom_postorder;
  __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
  local_610;
  __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
  local_608;
  iterator block_1;
  int control_flow_nesting_depth_limit;
  string local_5d8;
  DiagnosticStream local_5b8;
  BasicBlock **local_3e0;
  BasicBlock **local_3d8;
  __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
  local_3d0;
  BasicBlock *local_3c8;
  BasicBlock *idom;
  __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
  local_3b8;
  __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
  local_3b0;
  __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
  block;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *blocks;
  pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*> edge;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
  *__range4_1;
  undefined1 local_358 [8];
  vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
  edges;
  anon_class_8_1_8ddbd94e local_320;
  function<void_(const_spvtools::val::BasicBlock_*)> local_318;
  function<void_(const_spvtools::val::BasicBlock_*)> local_2f8;
  GetBlocksFunction local_2d8;
  anon_class_1_0_00000001 local_2b2;
  anon_class_1_0_00000001 local_2b1;
  undefined1 local_2b0 [6];
  anon_class_1_0_00000001 no_terminal_blocks;
  anon_class_1_0_00000001 ignore_block;
  vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  postorder;
  DiagnosticStream local_278;
  string local_a0;
  uint32_t local_7c;
  _Node_iterator_base<unsigned_int,_false> _Stack_78;
  value_type_conflict2 undefined_block;
  const_iterator __end4;
  const_iterator __begin4;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range4;
  undefined1 local_58 [6];
  bool first;
  string undef_blocks;
  Function *function;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_> *__range2;
  ValidationState_t *__local;
  
  this_00 = ValidationState_t::functions(_);
  __end2 = std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>::begin
                     (this_00);
  function = (Function *)
             std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>::end
                       (this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::val::Function_*,_std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>_>
                                *)&function);
    if (!bVar1) {
      __local._4_4_ = MaximalReconvergenceChecks(_);
      if (__local._4_4_ == SPV_SUCCESS) {
        __local._4_4_ = SPV_SUCCESS;
      }
      return __local._4_4_;
    }
    undef_blocks.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<spvtools::val::Function_*,_std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>_>
         ::operator*(&__end2);
    sVar5 = Function::undefined_block_count((Function *)undef_blocks.field_2._8_8_);
    if (sVar5 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_58,"{",(allocator<char> *)((long)&__range4 + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
      __range4._6_1_ = 1;
      this_01 = Function::undefined_blocks((Function *)undef_blocks.field_2._8_8_);
      __end4 = std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::begin(this_01);
      _Stack_78._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::end(this_01);
      while (bVar1 = std::__detail::operator!=
                               (&__end4.super__Node_iterator_base<unsigned_int,_false>,
                                &stack0xffffffffffffff88), bVar1) {
        pvVar6 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end4);
        local_7c = *pvVar6;
        ValidationState_t::getIdName_abi_cxx11_(&local_a0,_,local_7c);
        std::__cxx11::string::operator+=((string *)local_58,(string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        if ((__range4._6_1_ & 1) == 0) {
          std::__cxx11::string::operator+=((string *)local_58," ");
        }
        __range4._6_1_ = 0;
        std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end4);
      }
      uVar2 = Function::id((Function *)undef_blocks.field_2._8_8_);
      pIVar7 = ValidationState_t::FindDef(_,uVar2);
      ValidationState_t::diag(&local_278,_,SPV_ERROR_INVALID_CFG,pIVar7);
      pDVar8 = DiagnosticStream::operator<<(&local_278,(char (*) [10])"Block(s) ");
      pDVar8 = DiagnosticStream::operator<<
                         (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_58);
      pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [2])"}");
      pDVar8 = DiagnosticStream::operator<<
                         (pDVar8,(char (*) [45])" are referenced but not defined in function ");
      uVar2 = Function::id((Function *)undef_blocks.field_2._8_8_);
      ValidationState_t::getIdName_abi_cxx11_
                ((string *)
                 &postorder.
                  super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,_,uVar2);
      pDVar8 = DiagnosticStream::operator<<
                         (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&postorder.
                                     super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      std::__cxx11::string::~string
                ((string *)
                 &postorder.
                  super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      DiagnosticStream::~DiagnosticStream(&local_278);
      std::__cxx11::string::~string((string *)local_58);
      return sVar3;
    }
    std::
    vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>::
    vector((vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
            *)local_2b0);
    pvVar9 = Function::ordered_blocks((Function *)undef_blocks.field_2._8_8_);
    bVar1 = std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
            empty(pvVar9);
    if (!bVar1) {
      pBVar10 = Function::first_block((Function *)undef_blocks.field_2._8_8_);
      Function::AugmentedCFGSuccessorsFunction(&local_2d8,(Function *)undef_blocks.field_2._8_8_);
      std::function<void(spvtools::val::BasicBlock_const*)>::
      function<spvtools::val::PerformCfgChecks(spvtools::val::ValidationState_t&)::__0&,void>
                ((function<void(spvtools::val::BasicBlock_const*)> *)&local_2f8,&local_2b1);
      local_320.postorder =
           (vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
            *)local_2b0;
      std::function<void(spvtools::val::BasicBlock_const*)>::
      function<spvtools::val::PerformCfgChecks(spvtools::val::ValidationState_t&)::__1,void>
                ((function<void(spvtools::val::BasicBlock_const*)> *)&local_318,&local_320);
      std::function<bool(spvtools::val::BasicBlock_const*)>::
      function<spvtools::val::PerformCfgChecks(spvtools::val::ValidationState_t&)::__2&,void>
                ((function<bool(spvtools::val::BasicBlock_const*)> *)
                 &edges.
                  super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2b2);
      CFA<spvtools::val::BasicBlock>::DepthFirstTraversal
                (pBVar10,&local_2d8,&local_2f8,&local_318,
                 (function<bool_(const_spvtools::val::BasicBlock_*)> *)
                 &edges.
                  super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::function<bool_(const_spvtools::val::BasicBlock_*)>::~function
                ((function<bool_(const_spvtools::val::BasicBlock_*)> *)
                 &edges.
                  super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::function<void_(const_spvtools::val::BasicBlock_*)>::~function(&local_318);
      std::function<void_(const_spvtools::val::BasicBlock_*)>::~function(&local_2f8);
      std::
      function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
      ::~function(&local_2d8);
      Function::AugmentedCFGPredecessorsFunction
                ((GetBlocksFunction *)&__range4_1,(Function *)undef_blocks.field_2._8_8_);
      CFA<spvtools::val::BasicBlock>::CalculateDominators
                ((vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                  *)local_358,
                 (vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                  *)local_2b0,(get_blocks_func *)&__range4_1);
      std::
      function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
      ::~function((function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
                   *)&__range4_1);
      __end4_1 = std::
                 vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                 ::begin((vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                          *)local_358);
      edge.second = (BasicBlock *)
                    std::
                    vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                    ::end((vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                           *)local_358);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4_1,
                                (__normal_iterator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_*,_std::vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>_>
                                 *)&edge.second), bVar1) {
        ppVar14 = __gnu_cxx::
                  __normal_iterator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_*,_std::vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>_>
                  ::operator*(&__end4_1);
        edge.first = ppVar14->second;
        if (ppVar14->first != edge.first) {
          BasicBlock::SetImmediateDominator(ppVar14->first,edge.first);
        }
        __gnu_cxx::
        __normal_iterator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_*,_std::vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>_>
        ::operator++(&__end4_1);
      }
      std::
      vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
      ::~vector((vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                 *)local_358);
    }
    block._M_current =
         (BasicBlock **)Function::ordered_blocks((Function *)undef_blocks.field_2._8_8_);
    bVar1 = std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
            empty((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                   *)block._M_current);
    if (!bVar1) {
      local_3b8._M_current =
           (BasicBlock **)
           std::
           begin<std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>
                     (block._M_current);
      local_3b0 = __gnu_cxx::
                  __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                  ::operator+(&local_3b8,1);
      while( true ) {
        idom = (BasicBlock *)
               std::
               end<std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>
                         ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                           *)block._M_current);
        bVar1 = __gnu_cxx::operator!=
                          (&local_3b0,
                           (__normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                            *)&idom);
        if (!bVar1) break;
        ppBVar13 = __gnu_cxx::
                   __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                   ::operator*(&local_3b0);
        pBVar10 = BasicBlock::immediate_dominator(*ppBVar13);
        local_3c8 = pBVar10;
        if (pBVar10 != (BasicBlock *)0x0) {
          pBVar11 = Function::pseudo_entry_block((Function *)undef_blocks.field_2._8_8_);
          local_ac1 = false;
          if (pBVar10 != pBVar11) {
            local_3d8 = (BasicBlock **)
                        std::
                        begin<std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>
                                  (block._M_current);
            local_3e0 = local_3b0._M_current;
            local_3d0 = std::
                        find<__gnu_cxx::__normal_iterator<spvtools::val::BasicBlock**,std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>,spvtools::val::BasicBlock*>
                                  ((__normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                                    )local_3d8,local_3b0,&local_3c8);
            local_ac1 = __gnu_cxx::operator==(&local_3b0,&local_3d0);
          }
          if (local_ac1 != false) {
            uVar2 = BasicBlock::id(local_3c8);
            pIVar7 = ValidationState_t::FindDef(_,uVar2);
            ValidationState_t::diag(&local_5b8,_,SPV_ERROR_INVALID_CFG,pIVar7);
            pDVar8 = DiagnosticStream::operator<<(&local_5b8,(char (*) [7])0x623341);
            ppBVar13 = __gnu_cxx::
                       __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                       ::operator*(&local_3b0);
            uVar2 = BasicBlock::id(*ppBVar13);
            ValidationState_t::getIdName_abi_cxx11_(&local_5d8,_,uVar2);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_5d8);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [45])" appears in the binary before its dominator "
                               );
            uVar2 = BasicBlock::id(local_3c8);
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&control_flow_nesting_depth_limit,_,uVar2);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&control_flow_nesting_depth_limit);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            std::__cxx11::string::~string((string *)&control_flow_nesting_depth_limit);
            std::__cxx11::string::~string((string *)&local_5d8);
            DiagnosticStream::~DiagnosticStream(&local_5b8);
            block_1._M_current._4_4_ = 1;
            goto LAB_0051b0f9;
          }
        }
        __gnu_cxx::
        __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
        ::operator++(&local_3b0);
      }
      bVar1 = ValidationState_t::HasCapability(_,Shader);
      if (bVar1) {
        psVar12 = ValidationState_t::options(_);
        block_1._M_current._0_4_ = (psVar12->universal_limits_).max_control_flow_nesting_depth;
        local_608._M_current =
             (BasicBlock **)
             std::
             begin<std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>
                       (block._M_current);
        while( true ) {
          local_610._M_current =
               (BasicBlock **)
               std::
               end<std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>
                         (block._M_current);
          bVar1 = __gnu_cxx::operator!=(&local_608,&local_610);
          this = undef_blocks.field_2._8_8_;
          if (!bVar1) break;
          ppBVar13 = __gnu_cxx::
                     __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                     ::operator*(&local_608);
          iVar4 = Function::GetBlockDepth((Function *)this,*ppBVar13);
          if ((int)(uint32_t)block_1._M_current < iVar4) {
            ppBVar13 = __gnu_cxx::
                       __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                       ::operator*(&local_608);
            uVar2 = BasicBlock::id(*ppBVar13);
            pIVar7 = ValidationState_t::FindDef(_,uVar2);
            ValidationState_t::diag
                      ((DiagnosticStream *)
                       &postdom_postorder.
                        super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,_,SPV_ERROR_INVALID_CFG,
                       pIVar7);
            pDVar8 = DiagnosticStream::operator<<
                               ((DiagnosticStream *)
                                &postdom_postorder.
                                 super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (char (*) [45])"Maximum Control Flow nesting depth exceeded.");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            DiagnosticStream::~DiagnosticStream
                      ((DiagnosticStream *)
                       &postdom_postorder.
                        super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            block_1._M_current._4_4_ = 1;
            goto LAB_0051b0f9;
          }
          __gnu_cxx::
          __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
          ::operator++(&local_608);
        }
      }
    }
    bVar1 = ValidationState_t::HasCapability(_,Shader);
    if (bVar1) {
      std::
      vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
      ::clear((vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
               *)local_2b0);
      std::
      vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
      ::vector((vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                *)&back_edges.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)local_818);
      pvVar9 = Function::ordered_blocks((Function *)undef_blocks.field_2._8_8_);
      bVar1 = std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
              ::empty(pvVar9);
      if (!bVar1) {
        pBVar10 = Function::first_block((Function *)undef_blocks.field_2._8_8_);
        Function::AugmentedStructuralCFGSuccessorsFunction
                  (&local_838,(Function *)undef_blocks.field_2._8_8_);
        std::function<void(spvtools::val::BasicBlock_const*)>::
        function<spvtools::val::PerformCfgChecks(spvtools::val::ValidationState_t&)::__0&,void>
                  ((function<void(spvtools::val::BasicBlock_const*)> *)&local_858,&local_2b1);
        local_880.postorder =
             (vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
              *)local_2b0;
        std::function<void(spvtools::val::BasicBlock_const*)>::
        function<spvtools::val::PerformCfgChecks(spvtools::val::ValidationState_t&)::__3,void>
                  ((function<void(spvtools::val::BasicBlock_const*)> *)&local_878,&local_880);
        std::function<bool(spvtools::val::BasicBlock_const*)>::
        function<spvtools::val::PerformCfgChecks(spvtools::val::ValidationState_t&)::__2&,void>
                  ((function<bool(spvtools::val::BasicBlock_const*)> *)
                   &edges_1.
                    super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2b2);
        CFA<spvtools::val::BasicBlock>::DepthFirstTraversal
                  (pBVar10,&local_838,&local_858,&local_878,
                   (function<bool_(const_spvtools::val::BasicBlock_*)> *)
                   &edges_1.
                    super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::function<bool_(const_spvtools::val::BasicBlock_*)>::~function
                  ((function<bool_(const_spvtools::val::BasicBlock_*)> *)
                   &edges_1.
                    super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::function<void_(const_spvtools::val::BasicBlock_*)>::~function(&local_878);
        std::function<void_(const_spvtools::val::BasicBlock_*)>::~function(&local_858);
        std::
        function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
        ::~function(&local_838);
        Function::AugmentedStructuralCFGPredecessorsFunction
                  ((GetBlocksFunction *)&__range5,(Function *)undef_blocks.field_2._8_8_);
        CFA<spvtools::val::BasicBlock>::CalculateDominators
                  ((vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                    *)local_8b8,
                   (vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                    *)local_2b0,(get_blocks_func *)&__range5);
        std::
        function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
        ::~function((function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
                     *)&__range5);
        __end5 = std::
                 vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                 ::begin((vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                          *)local_8b8);
        edge_1.second =
             (BasicBlock *)
             std::
             vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
             ::end((vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                    *)local_8b8);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_*,_std::vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>_>
                                           *)&edge_1.second), bVar1) {
          ppVar14 = __gnu_cxx::
                    __normal_iterator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_*,_std::vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>_>
                    ::operator*(&__end5);
          local_900 = ppVar14->first;
          edge_1.first = ppVar14->second;
          if (local_900 != edge_1.first) {
            BasicBlock::SetImmediateStructuralDominator(local_900,edge_1.first);
          }
          __gnu_cxx::
          __normal_iterator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_*,_std::vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>_>
          ::operator++(&__end5);
        }
        pBVar10 = Function::pseudo_exit_block((Function *)undef_blocks.field_2._8_8_);
        Function::AugmentedStructuralCFGPredecessorsFunction
                  (&local_920,(Function *)undef_blocks.field_2._8_8_);
        std::function<void(spvtools::val::BasicBlock_const*)>::
        function<spvtools::val::PerformCfgChecks(spvtools::val::ValidationState_t&)::__0&,void>
                  ((function<void(spvtools::val::BasicBlock_const*)> *)&local_940,&local_2b1);
        local_968.postdom_postorder =
             (vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
              *)&back_edges.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::function<void(spvtools::val::BasicBlock_const*)>::
        function<spvtools::val::PerformCfgChecks(spvtools::val::ValidationState_t&)::__4,void>
                  ((function<void(spvtools::val::BasicBlock_const*)> *)&local_960,&local_968);
        std::function<bool(spvtools::val::BasicBlock_const*)>::
        function<spvtools::val::PerformCfgChecks(spvtools::val::ValidationState_t&)::__2&,void>
                  ((function<bool(spvtools::val::BasicBlock_const*)> *)
                   &postdom_edges.
                    super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2b2);
        CFA<spvtools::val::BasicBlock>::DepthFirstTraversal
                  (pBVar10,&local_920,&local_940,&local_960,
                   (function<bool_(const_spvtools::val::BasicBlock_*)> *)
                   &postdom_edges.
                    super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::function<bool_(const_spvtools::val::BasicBlock_*)>::~function
                  ((function<bool_(const_spvtools::val::BasicBlock_*)> *)
                   &postdom_edges.
                    super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::function<void_(const_spvtools::val::BasicBlock_*)>::~function(&local_960);
        std::function<void_(const_spvtools::val::BasicBlock_*)>::~function(&local_940);
        std::
        function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
        ::~function(&local_920);
        Function::AugmentedStructuralCFGSuccessorsFunction
                  ((GetBlocksFunction *)&__range5_1,(Function *)undef_blocks.field_2._8_8_);
        CFA<spvtools::val::BasicBlock>::CalculateDominators
                  ((vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                    *)local_9a0,
                   (vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                    *)&back_edges.
                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (get_blocks_func *)&__range5_1);
        std::
        function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
        ::~function((function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
                     *)&__range5_1);
        __end5_1 = std::
                   vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                   ::begin((vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                            *)local_9a0);
        edge_2.second =
             (BasicBlock *)
             std::
             vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
             ::end((vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                    *)local_9a0);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end5_1,
                                  (__normal_iterator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_*,_std::vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>_>
                                   *)&edge_2.second), bVar1) {
          ppVar14 = __gnu_cxx::
                    __normal_iterator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_*,_std::vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>_>
                    ::operator*(&__end5_1);
          local_9e8 = ppVar14->first;
          edge_2.first = ppVar14->second;
          BasicBlock::SetImmediateStructuralPostDominator(local_9e8,edge_2.first);
          __gnu_cxx::
          __normal_iterator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_*,_std::vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>_>
          ::operator++(&__end5_1);
        }
        pBVar10 = Function::pseudo_entry_block((Function *)undef_blocks.field_2._8_8_);
        Function::AugmentedStructuralCFGSuccessorsFunction
                  (&local_a08,(Function *)undef_blocks.field_2._8_8_);
        std::function<void(spvtools::val::BasicBlock_const*)>::
        function<spvtools::val::PerformCfgChecks(spvtools::val::ValidationState_t&)::__0&,void>
                  ((function<void(spvtools::val::BasicBlock_const*)> *)&local_a28,&local_2b1);
        std::function<void(spvtools::val::BasicBlock_const*)>::
        function<spvtools::val::PerformCfgChecks(spvtools::val::ValidationState_t&)::__0&,void>
                  ((function<void(spvtools::val::BasicBlock_const*)> *)&local_a48,&local_2b1);
        local_a70.back_edges =
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)local_818;
        std::function<void(spvtools::val::BasicBlock_const*,spvtools::val::BasicBlock_const*)>::
        function<spvtools::val::PerformCfgChecks(spvtools::val::ValidationState_t&)::__5,void>
                  ((function<void(spvtools::val::BasicBlock_const*,spvtools::val::BasicBlock_const*)>
                    *)&local_a68,&local_a70);
        std::function<bool(spvtools::val::BasicBlock_const*)>::
        function<spvtools::val::PerformCfgChecks(spvtools::val::ValidationState_t&)::__2&,void>
                  ((function<bool(spvtools::val::BasicBlock_const*)> *)&error_1,&local_2b2);
        CFA<spvtools::val::BasicBlock>::DepthFirstTraversal
                  (pBVar10,&local_a08,&local_a28,&local_a48,&local_a68,
                   (function<bool_(const_spvtools::val::BasicBlock_*)> *)&error_1);
        std::function<bool_(const_spvtools::val::BasicBlock_*)>::~function
                  ((function<bool_(const_spvtools::val::BasicBlock_*)> *)&error_1);
        std::function<void_(const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*)>::
        ~function(&local_a68);
        std::function<void_(const_spvtools::val::BasicBlock_*)>::~function(&local_a48);
        std::function<void_(const_spvtools::val::BasicBlock_*)>::~function(&local_a28);
        std::
        function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
        ::~function(&local_a08);
        std::
        vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
        ::~vector((vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                   *)local_9a0);
        std::
        vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
        ::~vector((vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                   *)local_8b8);
      }
      UpdateContinueConstructExitBlocks
                ((Function *)undef_blocks.field_2._8_8_,
                 (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)local_818);
      sVar3 = StructuredControlFlowChecks
                        (_,(Function *)undef_blocks.field_2._8_8_,
                         (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          *)local_818,
                         (vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                          *)local_2b0);
      if (sVar3 != SPV_SUCCESS) {
        __local._4_4_ = sVar3;
      }
      block_1._M_current._5_3_ = 0;
      block_1._M_current._4_1_ = sVar3 != SPV_SUCCESS;
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *)local_818);
      std::
      vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
      ::~vector((vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                 *)&back_edges.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (block_1._M_current._4_4_ == 0) goto LAB_0051b0ef;
    }
    else {
LAB_0051b0ef:
      block_1._M_current._4_4_ = 0;
    }
LAB_0051b0f9:
    std::
    vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>::
    ~vector((vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
             *)local_2b0);
    if (block_1._M_current._4_4_ != 0) {
      return __local._4_4_;
    }
    __gnu_cxx::
    __normal_iterator<spvtools::val::Function_*,_std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

spv_result_t PerformCfgChecks(ValidationState_t& _) {
  for (auto& function : _.functions()) {
    // Check all referenced blocks are defined within a function
    if (function.undefined_block_count() != 0) {
      std::string undef_blocks("{");
      bool first = true;
      for (auto undefined_block : function.undefined_blocks()) {
        undef_blocks += _.getIdName(undefined_block);
        if (!first) {
          undef_blocks += " ";
        }
        first = false;
      }
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(function.id()))
             << "Block(s) " << undef_blocks << "}"
             << " are referenced but not defined in function "
             << _.getIdName(function.id());
    }

    // Set each block's immediate dominator.
    //
    // We want to analyze all the blocks in the function, even in degenerate
    // control flow cases including unreachable blocks.  So use the augmented
    // CFG to ensure we cover all the blocks.
    std::vector<const BasicBlock*> postorder;
    auto ignore_block = [](const BasicBlock*) {};
    auto no_terminal_blocks = [](const BasicBlock*) { return false; };
    if (!function.ordered_blocks().empty()) {
      /// calculate dominators
      CFA<BasicBlock>::DepthFirstTraversal(
          function.first_block(), function.AugmentedCFGSuccessorsFunction(),
          ignore_block, [&](const BasicBlock* b) { postorder.push_back(b); },
          no_terminal_blocks);
      auto edges = CFA<BasicBlock>::CalculateDominators(
          postorder, function.AugmentedCFGPredecessorsFunction());
      for (auto edge : edges) {
        if (edge.first != edge.second)
          edge.first->SetImmediateDominator(edge.second);
      }
    }

    auto& blocks = function.ordered_blocks();
    if (!blocks.empty()) {
      // Check if the order of blocks in the binary appear before the blocks
      // they dominate
      for (auto block = begin(blocks) + 1; block != end(blocks); ++block) {
        if (auto idom = (*block)->immediate_dominator()) {
          if (idom != function.pseudo_entry_block() &&
              block == std::find(begin(blocks), block, idom)) {
            return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(idom->id()))
                   << "Block " << _.getIdName((*block)->id())
                   << " appears in the binary before its dominator "
                   << _.getIdName(idom->id());
          }
        }
      }
      // If we have structured control flow, check that no block has a control
      // flow nesting depth larger than the limit.
      if (_.HasCapability(spv::Capability::Shader)) {
        const int control_flow_nesting_depth_limit =
            _.options()->universal_limits_.max_control_flow_nesting_depth;
        for (auto block = begin(blocks); block != end(blocks); ++block) {
          if (function.GetBlockDepth(*block) >
              control_flow_nesting_depth_limit) {
            return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef((*block)->id()))
                   << "Maximum Control Flow nesting depth exceeded.";
          }
        }
      }
    }

    /// Structured control flow checks are only required for shader capabilities
    if (_.HasCapability(spv::Capability::Shader)) {
      // Calculate structural dominance.
      postorder.clear();
      std::vector<const BasicBlock*> postdom_postorder;
      std::vector<std::pair<uint32_t, uint32_t>> back_edges;
      if (!function.ordered_blocks().empty()) {
        /// calculate dominators
        CFA<BasicBlock>::DepthFirstTraversal(
            function.first_block(),
            function.AugmentedStructuralCFGSuccessorsFunction(), ignore_block,
            [&](const BasicBlock* b) { postorder.push_back(b); },
            no_terminal_blocks);
        auto edges = CFA<BasicBlock>::CalculateDominators(
            postorder, function.AugmentedStructuralCFGPredecessorsFunction());
        for (auto edge : edges) {
          if (edge.first != edge.second)
            edge.first->SetImmediateStructuralDominator(edge.second);
        }

        /// calculate post dominators
        CFA<BasicBlock>::DepthFirstTraversal(
            function.pseudo_exit_block(),
            function.AugmentedStructuralCFGPredecessorsFunction(), ignore_block,
            [&](const BasicBlock* b) { postdom_postorder.push_back(b); },
            no_terminal_blocks);
        auto postdom_edges = CFA<BasicBlock>::CalculateDominators(
            postdom_postorder,
            function.AugmentedStructuralCFGSuccessorsFunction());
        for (auto edge : postdom_edges) {
          edge.first->SetImmediateStructuralPostDominator(edge.second);
        }
        /// calculate back edges.
        CFA<BasicBlock>::DepthFirstTraversal(
            function.pseudo_entry_block(),
            function.AugmentedStructuralCFGSuccessorsFunction(), ignore_block,
            ignore_block,
            [&](const BasicBlock* from, const BasicBlock* to) {
              // A back edge must be a real edge. Since the augmented successors
              // contain structural edges, filter those from consideration.
              for (const auto* succ : *(from->successors())) {
                if (succ == to) back_edges.emplace_back(from->id(), to->id());
              }
            },
            no_terminal_blocks);
      }
      UpdateContinueConstructExitBlocks(function, back_edges);

      if (auto error =
              StructuredControlFlowChecks(_, &function, back_edges, postorder))
        return error;
    }
  }

  if (auto error = MaximalReconvergenceChecks(_)) {
    return error;
  }

  return SPV_SUCCESS;
}